

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O3

void on_message_receiver_state_changed
               (void *context,MESSAGE_RECEIVER_STATE new_state,MESSAGE_RECEIVER_STATE previous_state
               )

{
  byte bVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  byte bVar2;
  undefined4 in_register_00000014;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                 ,"on_message_receiver_state_changed",0x200,1,
                 "on_message_receiver_state_changed called with NULL context");
      return;
    }
  }
  else if (new_state != previous_state) {
    if (*(int *)((long)context + 0x50) == 3) {
      if (new_state != MESSAGE_RECEIVER_STATE_OPEN) {
        *(undefined4 *)((long)context + 0x50) = 4;
        (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
        return;
      }
    }
    else if ((*(int *)((long)context + 0x50) == 1) && (new_state != MESSAGE_RECEIVER_STATE_OPENING))
    {
      if (new_state != MESSAGE_RECEIVER_STATE_OPEN) {
        *(undefined4 *)((long)context + 0x50) = 0;
        (**(code **)((long)context + 0x30))
                  (*(undefined8 *)((long)context + 0x38),2,
                   CONCAT44(in_register_00000014,previous_state),*(code **)((long)context + 0x30));
        return;
      }
      bVar1 = *(byte *)((long)context + 0x68);
      bVar2 = bVar1 | 2;
      *(byte *)((long)context + 0x68) = bVar2;
      if ((bVar1 & 1) != 0) {
        *(undefined4 *)((long)context + 0x50) = 3;
        (**(code **)((long)context + 0x30))
                  (*(undefined8 *)((long)context + 0x38),1,bVar2,*(code **)((long)context + 0x30));
        return;
      }
    }
  }
  return;
}

Assistant:

static void on_message_receiver_state_changed(const void* context, MESSAGE_RECEIVER_STATE new_state, MESSAGE_RECEIVER_STATE previous_state)
{
    IOTHUBTRANSPORT_AMQP_METHODS_HANDLE amqp_methods_handle = (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)context;
    if ((new_state != previous_state) &&
        (new_state == MESSAGE_RECEIVER_STATE_ERROR))
    {
        amqp_methods_handle->on_methods_error(amqp_methods_handle->on_methods_error_context);
    }
    else
    {
        if ((new_state == MESSAGE_RECEIVER_STATE_IDLE) && (previous_state == MESSAGE_RECEIVER_STATE_OPEN))
        {
            amqp_methods_handle->receiver_link_disconnected = true;
        }
        call_methods_unsubscribed_if_needed(amqp_methods_handle);
    }
}